

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGetterCalls.cpp
# Opt level: O0

char * glcts::TextureCubeMapArrayGetterCalls::getStringForGetTexLevelParameterPname(GLenum pname)

{
  char *pcStack_10;
  GLenum pname_local;
  
  if (pname == 0x86a1) {
    pcStack_10 = "GL_TEXTURE_COMPRESSED";
  }
  else if (pname == 0x805f) {
    pcStack_10 = "GL_TEXTURE_ALPHA_SIZE";
  }
  else if (pname == 0x805e) {
    pcStack_10 = "GL_TEXTURE_BLUE_SIZE";
  }
  else if (pname == 0x805d) {
    pcStack_10 = "GL_TEXTURE_GREEN_SIZE";
  }
  else if (pname == 0x805c) {
    pcStack_10 = "GL_TEXTURE_RED_SIZE";
  }
  else if (pname == 0x884a) {
    pcStack_10 = "GL_TEXTURE_DEPTH_SIZE";
  }
  else if (pname == 0x8c3f) {
    pcStack_10 = "GL_TEXTURE_SHARED_SIZE";
  }
  else if (pname == 0x88f1) {
    pcStack_10 = "GL_TEXTURE_STENCIL_SIZE";
  }
  else if (pname == 0x8c13) {
    pcStack_10 = "GL_TEXTURE_ALPHA_TYPE";
  }
  else if (pname == 0x8c12) {
    pcStack_10 = "GL_TEXTURE_BLUE_TYPE";
  }
  else if (pname == 0x8c11) {
    pcStack_10 = "GL_TEXTURE_GREEN_TYPE";
  }
  else if (pname == 0x8c10) {
    pcStack_10 = "GL_TEXTURE_RED_TYPE";
  }
  else if (pname == 0x8c16) {
    pcStack_10 = "GL_TEXTURE_DEPTH_TYPE";
  }
  else if (pname == 0x1003) {
    pcStack_10 = "GL_TEXTURE_INTERNAL_FORMAT";
  }
  else if (pname == 0x1000) {
    pcStack_10 = "GL_TEXTURE_WIDTH";
  }
  else if (pname == 0x1001) {
    pcStack_10 = "GL_TEXTURE_HEIGHT";
  }
  else if (pname == 0x8071) {
    pcStack_10 = "GL_TEXTURE_DEPTH";
  }
  else {
    pcStack_10 = "UNKNOWN PARAMETER NAME";
  }
  return pcStack_10;
}

Assistant:

const char* TextureCubeMapArrayGetterCalls::getStringForGetTexLevelParameterPname(glw::GLenum pname)
{
	if (pname == GL_TEXTURE_COMPRESSED)
		return "GL_TEXTURE_COMPRESSED";
	if (pname == GL_TEXTURE_ALPHA_SIZE)
		return "GL_TEXTURE_ALPHA_SIZE";
	if (pname == GL_TEXTURE_BLUE_SIZE)
		return "GL_TEXTURE_BLUE_SIZE";
	if (pname == GL_TEXTURE_GREEN_SIZE)
		return "GL_TEXTURE_GREEN_SIZE";
	if (pname == GL_TEXTURE_RED_SIZE)
		return "GL_TEXTURE_RED_SIZE";
	if (pname == GL_TEXTURE_DEPTH_SIZE)
		return "GL_TEXTURE_DEPTH_SIZE";
	if (pname == GL_TEXTURE_SHARED_SIZE)
		return "GL_TEXTURE_SHARED_SIZE";
	if (pname == GL_TEXTURE_STENCIL_SIZE)
		return "GL_TEXTURE_STENCIL_SIZE";
	if (pname == GL_TEXTURE_ALPHA_TYPE)
		return "GL_TEXTURE_ALPHA_TYPE";
	if (pname == GL_TEXTURE_BLUE_TYPE)
		return "GL_TEXTURE_BLUE_TYPE";
	if (pname == GL_TEXTURE_GREEN_TYPE)
		return "GL_TEXTURE_GREEN_TYPE";
	if (pname == GL_TEXTURE_RED_TYPE)
		return "GL_TEXTURE_RED_TYPE";
	if (pname == GL_TEXTURE_DEPTH_TYPE)
		return "GL_TEXTURE_DEPTH_TYPE";
	if (pname == GL_TEXTURE_INTERNAL_FORMAT)
		return "GL_TEXTURE_INTERNAL_FORMAT";
	if (pname == GL_TEXTURE_WIDTH)
		return "GL_TEXTURE_WIDTH";
	if (pname == GL_TEXTURE_HEIGHT)
		return "GL_TEXTURE_HEIGHT";
	if (pname == GL_TEXTURE_DEPTH)
		return "GL_TEXTURE_DEPTH";

	return "UNKNOWN PARAMETER NAME";
}